

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

void __thiscall TxConfirmStats::Record(TxConfirmStats *this,int blocksToConfirm,double feerate)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  reference pvVar5;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  size_t i;
  uint bucketindex;
  int periodsToConfirm;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffffa8;
  map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
  *in_stack_ffffffffffffffb0;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *local_38;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < in_ESI) {
    iVar1 = *(int *)(in_RDI + 0x78);
    uVar2 = *(uint *)(in_RDI + 0x78);
    std::
    map<double,_unsigned_int,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
    ::lower_bound(in_stack_ffffffffffffffb0,(key_type_conflict3 *)in_stack_ffffffffffffffa8);
    std::_Rb_tree_const_iterator<std::pair<const_double,_unsigned_int>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_double,_unsigned_int>_> *)
               in_stack_ffffffffffffffa8);
    local_38 = (vector<double,_std::allocator<double>_> *)
               (long)(int)(((in_ESI + iVar1) - 1U) / uVar2);
    while (this_00 = local_38,
          pvVar4 = (vector<double,_std::allocator<double>_> *)
                   std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::size(in_stack_ffffffffffffffa8), this_00 <= pvVar4) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)this_00,(size_type)in_stack_ffffffffffffffb0);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_00,(size_type)in_stack_ffffffffffffffb0);
      *pvVar5 = *pvVar5 + 1.0;
      local_38 = (vector<double,_std::allocator<double>_> *)
                 ((long)&(local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (this_00,(size_type)in_stack_ffffffffffffffb0);
    *pvVar5 = *pvVar5 + 1.0;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(size_type)in_XMM0_Qa)
    ;
    *pvVar5 = in_XMM0_Qa + *pvVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TxConfirmStats::Record(int blocksToConfirm, double feerate)
{
    // blocksToConfirm is 1-based
    if (blocksToConfirm < 1)
        return;
    int periodsToConfirm = (blocksToConfirm + scale - 1) / scale;
    unsigned int bucketindex = bucketMap.lower_bound(feerate)->second;
    for (size_t i = periodsToConfirm; i <= confAvg.size(); i++) {
        confAvg[i - 1][bucketindex]++;
    }
    txCtAvg[bucketindex]++;
    m_feerate_avg[bucketindex] += feerate;
}